

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasum.c
# Opt level: O0

doublereal dasum_(integer *n,doublereal *dx,integer *incx)

{
  bool bVar1;
  int iVar2;
  double local_f0;
  double local_e0;
  double local_d0;
  double local_c0;
  double local_b0;
  double local_a0;
  double local_90;
  double local_88;
  integer mp1;
  integer nincx;
  doublereal dtemp;
  integer m;
  integer i;
  doublereal d__6;
  doublereal d__5;
  doublereal d__4;
  doublereal d__3;
  doublereal d__2;
  doublereal d__1;
  doublereal ret_val;
  integer *incx_local;
  doublereal *dx_local;
  integer *n_local;
  
  _mp1 = 0.0;
  if ((*n < 1) || (*incx < 1)) {
    return 0.0;
  }
  if (*incx != 1) {
    dtemp._4_4_ = 1;
    while( true ) {
      if (*incx < 0) {
        bVar1 = *n * *incx <= dtemp._4_4_;
      }
      else {
        bVar1 = dtemp._4_4_ <= *n * *incx;
      }
      if (!bVar1) break;
      local_88 = dx[dtemp._4_4_ + -1];
      if (local_88 < 0.0) {
        local_88 = -local_88;
      }
      _mp1 = local_88 + _mp1;
      dtemp._4_4_ = *incx + dtemp._4_4_;
    }
    return _mp1;
  }
  iVar2 = *n % 6;
  if (iVar2 != 0) {
    for (dtemp._4_4_ = 1; dtemp._4_4_ <= iVar2; dtemp._4_4_ = dtemp._4_4_ + 1) {
      local_90 = dx[dtemp._4_4_ + -1];
      if (local_90 < 0.0) {
        local_90 = -local_90;
      }
      _mp1 = local_90 + _mp1;
    }
    if (*n < 6) {
      return _mp1;
    }
  }
  for (dtemp._4_4_ = iVar2 + 1; dtemp._4_4_ <= *n; dtemp._4_4_ = dtemp._4_4_ + 6) {
    local_a0 = dx[dtemp._4_4_ + -1];
    if (local_a0 < 0.0) {
      local_a0 = -local_a0;
    }
    local_b0 = dx[dtemp._4_4_];
    if (local_b0 < 0.0) {
      local_b0 = -local_b0;
    }
    local_c0 = dx[dtemp._4_4_ + 1];
    if (local_c0 < 0.0) {
      local_c0 = -local_c0;
    }
    local_d0 = dx[dtemp._4_4_ + 2];
    if (local_d0 < 0.0) {
      local_d0 = -local_d0;
    }
    local_e0 = dx[dtemp._4_4_ + 3];
    if (local_e0 < 0.0) {
      local_e0 = -local_e0;
    }
    local_f0 = dx[dtemp._4_4_ + 4];
    if (local_f0 < 0.0) {
      local_f0 = -local_f0;
    }
    _mp1 = _mp1 + local_a0 + local_b0 + local_c0 + local_d0 + local_e0 + local_f0;
  }
  return _mp1;
}

Assistant:

doublereal dasum_(integer *n, doublereal *dx, integer *incx)
{


    /* System generated locals */
 
    doublereal ret_val, d__1, d__2, d__3, d__4, d__5, d__6;

    /* Local variables */
    integer i, m;
    doublereal dtemp;
    integer nincx, mp1;


/*     takes the sum of the absolute values.   
       jack dongarra, linpack, 3/11/78.   
       modified 3/93 to return if incx .le. 0.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define DX(I) dx[(I)-1]


    ret_val = 0.;
    dtemp = 0.;
    if (*n <= 0 || *incx <= 0) {
	return ret_val;
    }
    if (*incx == 1) {
	goto L20;
    }

/*        code for increment not equal to 1 */

    nincx = *n * *incx;
    for (i = 1; *incx < 0 ? i >= nincx : i <= nincx; i += *incx) {
	dtemp += (d__1 = DX(i), abs(d__1));
/* L10: */
    }
    ret_val = dtemp;
    return ret_val;

/*        code for increment equal to 1   


          clean-up loop */

L20:
    m = *n % 6;
    if (m == 0) {
	goto L40;
    }
    for (i = 1; i <= m; ++i) {
	dtemp += (d__1 = DX(i), abs(d__1));
/* L30: */
    }
    if (*n < 6) {
	goto L60;
    }
L40:
    mp1 = m + 1;
    for (i = mp1; i <= *n; i += 6) {
	dtemp = dtemp + (d__1 = DX(i), abs(d__1)) + (d__2 = DX(i + 1), abs(
		d__2)) + (d__3 = DX(i + 2), abs(d__3)) + (d__4 = DX(i + 3), 
		abs(d__4)) + (d__5 = DX(i + 4), abs(d__5)) + (d__6 = DX(i + 5)
		, abs(d__6));
/* L50: */
    }
L60:
    ret_val = dtemp;
    return ret_val;
}